

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
::_reduce_column(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
                 *this,Index target,Index eventIndex)

{
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
  *targetColumn;
  uint uVar1;
  uint uVar2;
  undefined1 *puVar3;
  Zp_field_operators<unsigned_int,_void> *this_00;
  node_ptr plVar4;
  Column_support *pCVar5;
  int iVar6;
  pointer pIVar7;
  uint uVar8;
  ulong uVar9;
  Column_support *pCVar10;
  uint local_44;
  Column_support *local_40;
  pointer local_38;
  
  pIVar7 = (this->reducedMatrixR_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar10 = &pIVar7[target].column_;
  puVar3 = *(undefined1 **)&(pCVar10->super_type).data_.root_plus_size_;
  if ((Column_support *)puVar3 != pCVar10 && puVar3 != (undefined1 *)0x0) {
    local_38 = pIVar7 + target;
    uVar9 = (ulong)*(uint *)&(*(node_ptr *)((long)&(local_38->column_).super_type.data_ + 8))[1].
                             next_;
    if (uVar9 != 0xffffffff) {
      uVar1 = (this->pivotToColumnIndex_).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9];
      pCVar5 = local_40;
      while( true ) {
        local_40 = pCVar10;
        if (uVar1 == 0xffffffff) {
          (this->pivotToColumnIndex_).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] = target;
          local_40 = pCVar5;
          RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
          ::_update_barcode(&this->super_RU_pairing_option,(ID_index)uVar9,eventIndex);
          return;
        }
        pIVar7 = (this->reducedMatrixR_).matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar3 = *(undefined1 **)&pIVar7[uVar1].column_.super_type.data_.root_plus_size_;
        uVar8 = 0;
        if ((Column_support *)puVar3 != &pIVar7[uVar1].column_ && puVar3 != (undefined1 *)0x0) {
          uVar8 = *(uint *)&pIVar7[uVar1].column_.super_type.data_.root_plus_size_.m_header.
                            super_node.prev_[-1].prev_;
        }
        this_00 = this->operators_;
        uVar2 = this_00->characteristic_;
        if (uVar2 <= uVar8) {
          uVar8 = uVar8 % uVar2;
        }
        targetColumn = pIVar7 + target;
        local_44 = (this_00->inverse_).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar8];
        plVar4 = (targetColumn->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
        iVar6 = 0;
        if (plVar4 != (node_ptr)&targetColumn->column_ && plVar4 != (node_ptr)0x0) {
          iVar6 = *(int *)&(targetColumn->column_).super_type.data_.root_plus_size_.m_header.
                           super_node.prev_[-1].prev_;
        }
        persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                  (this_00,&local_44,uVar2 - iVar6);
        _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>>
                  (&local_44,pIVar7 + uVar1,targetColumn);
        pIVar7 = (this->mirrorMatrixU_).matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>>
                  (&local_44,pIVar7 + uVar1,pIVar7 + target);
        puVar3 = *(undefined1 **)&(local_40->super_type).data_.root_plus_size_;
        if (((puVar3 == (undefined1 *)0x0) || ((Column_support *)puVar3 == local_40)) ||
           (uVar9 = (ulong)*(uint *)&(*(node_ptr *)((long)&(local_38->column_).super_type.data_ + 8)
                                     )[1].next_, uVar9 == 0xffffffff)) break;
        uVar1 = (this->pivotToColumnIndex_).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9];
        pCVar10 = local_40;
        pCVar5 = local_40;
      }
      pIVar7 = (this->reducedMatrixR_).matrix_.
               super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
  ::_add_bar(&this->super_RU_pairing_option,pIVar7[target].super_Column_dimension_option.dim_,
             eventIndex);
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column(Index target, Index eventIndex)
{
  auto get_column_with_pivot_ = [&](ID_index pivot) -> Index {
    if (pivot == Master_matrix::template get_null_value<ID_index>())
      return Master_matrix::template get_null_value<Index>();
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      auto it = pivotToColumnIndex_.find(pivot);
      if (it == pivotToColumnIndex_.end())
        return Master_matrix::template get_null_value<Index>();
      else
        return it->second;
    } else {
      return pivotToColumnIndex_[pivot];
    }
  };

  Column& curr = reducedMatrixR_.get_column(target);
  ID_index pivot = curr.get_pivot();
  Index currIndex = get_column_with_pivot_(pivot);

  while (pivot != Master_matrix::template get_null_value<ID_index>() &&
         currIndex != Master_matrix::template get_null_value<Index>()) {
    _reduce_column_by(target, currIndex);
    pivot = curr.get_pivot();
    currIndex = get_column_with_pivot_(pivot);
  }

  if (pivot != Master_matrix::template get_null_value<ID_index>()) {
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      pivotToColumnIndex_.try_emplace(pivot, target);
    } else {
      pivotToColumnIndex_[pivot] = target;
    }
    _update_barcode(pivot, eventIndex);
  } else {
    _add_bar(get_column_dimension(target), eventIndex);
  }
}